

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall Button::draw(Button *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Theme *pTVar7;
  ALLEGRO_COLOR *pAVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Theme *pTVar12;
  Theme *pTVar13;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined4 uVar15;
  double dVar14;
  undefined8 in_XMM3_Qa;
  undefined4 uVar16;
  undefined8 uVar17;
  SaveState state;
  undefined4 local_468;
  undefined4 local_458;
  undefined4 local_438;
  undefined1 local_420 [1024];
  
  uVar16 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
  uVar15 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  pTVar7 = ((this->super_Widget).dialog)->theme;
  al_store_state(local_420,0xffff);
  if (this->pushed == true) {
    pAVar8 = &pTVar7->bg;
    lVar11 = 0x18;
    pTVar12 = (Theme *)&pTVar7->fg;
    pTVar13 = pTVar7;
  }
  else {
    pTVar13 = (Theme *)&pTVar7->fg;
    pAVar8 = &pTVar7->fg;
    lVar11 = 8;
    pTVar12 = pTVar7;
  }
  uVar1._0_4_ = pAVar8->b;
  uVar1._4_4_ = pAVar8->a;
  uVar2._0_4_ = (pTVar13->bg).r;
  uVar2._4_4_ = (pTVar13->bg).g;
  uVar3 = *(undefined8 *)((long)&(pTVar7->bg).r + lVar11);
  uVar17._0_4_ = (pTVar12->bg).r;
  uVar17._4_4_ = (pTVar12->bg).g;
  iVar9 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  local_438 = (undefined4)uVar3;
  if ((char)iVar9 != '\0') {
    local_438 = in_XMM1_Da;
    uVar17 = al_map_rgb(0x40,0x40,0x40);
  }
  al_draw_filled_rectangle
            ((float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
             CONCAT44(uVar15,(float)(this->super_Widget).x2),
             CONCAT44(uVar16,(float)(this->super_Widget).y2),uVar17,local_438);
  dVar14 = (double)(this->super_Widget).x2 + -0.5;
  al_draw_rectangle((float)(this->super_Widget).x1 + 0.5,(float)(this->super_Widget).y1 + 0.5,
                    CONCAT44((int)((ulong)dVar14 >> 0x20),(float)dVar14),
                    (float)(this->super_Widget).y2 + -0.5,uVar2,(undefined4)uVar1,0);
  al_set_blender(0,1,3);
  iVar9 = (this->super_Widget).y1;
  iVar4 = (this->super_Widget).y2;
  uVar10 = al_get_font_line_height(pTVar7->font);
  iVar5 = (this->super_Widget).x1;
  iVar6 = (this->super_Widget).x2;
  al_draw_text((undefined4)uVar2,uVar1,
               (float)(((iVar5 + iVar6) - (iVar5 + iVar6 + 1 >> 0x1f)) + 1 >> 1),
               (float)((int)(~uVar10 + iVar4 + iVar9) / 2),pTVar7->font,1,
               (this->text)._M_dataplus._M_p);
  al_restore_state(local_420);
  return;
}

Assistant:

void Button::draw()
{
   const Theme & theme = this->dialog->get_theme();
   ALLEGRO_COLOR fg;
   ALLEGRO_COLOR bg;
   SaveState state;
   double y;

   if (this->pushed) {
      fg = theme.bg;
      bg = theme.fg;
   }
   else {
      fg = theme.fg;
      bg = theme.bg;
   }

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(this->x1, this->y1,
      this->x2, this->y2, bg);
   al_draw_rectangle(this->x1 + 0.5, this->y1 + 0.5,
      this->x2 - 0.5, this->y2 - 0.5, fg, 0);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   /* Center the text vertically in the button, taking the font size
    * into consideration.
    */
   y = (this->y1 + this->y2 - al_get_font_line_height(theme.font) - 1) / 2;

   al_draw_text(theme.font, fg, (this->x1 + this->x2 + 1)/2,
      y, ALLEGRO_ALIGN_CENTRE, this->text.c_str());
}